

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int number;
  LogMessage *pLVar2;
  MessageOptions *this;
  Data *pDVar3;
  FieldDescriptor *pFStack_a8;
  int field_number;
  FieldDescriptor *field;
  undefined1 auStack_98 [4];
  uint32_t tag;
  MessageSetParser message_set;
  LogMessage local_78;
  Voidify local_65 [20];
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  Descriptor *local_38;
  Reflection *reflection;
  Descriptor *descriptor;
  ParseContext *ctx_local;
  char *ptr_local;
  Message *msg_local;
  
  descriptor = (Descriptor *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  reflection = (Reflection *)Message::GetDescriptor(msg);
  local_38 = (Descriptor *)Message::GetReflection((Message *)ptr_local);
  local_51 = 0;
  if (reflection == (Reflection *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x316,"descriptor");
    local_51 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  message_set.reflection._7_1_ = 0;
  if (local_38 == (Descriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x317,"reflection");
    message_set.reflection._7_1_ = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar2);
  }
  if ((message_set.reflection._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  this = Descriptor::options((Descriptor *)reflection);
  bVar1 = MessageOptions::message_set_wire_format(this);
  if (bVar1) {
    _auStack_98 = (Message *)ptr_local;
    message_set.msg = (Message *)reflection;
    message_set.descriptor = local_38;
    msg_local = (Message *)
                MessageSetParser::ParseMessageSet
                          ((MessageSetParser *)auStack_98,(char *)ctx_local,
                           (ParseContext *)descriptor);
  }
  else {
    do {
      bVar1 = ParseContext::Done((ParseContext *)descriptor,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&field + 4),0);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((field._4_4_ == 0) || ((field._4_4_ & 7) == 4)) {
        EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)descriptor,field._4_4_);
        return (char *)ctx_local;
      }
      number = WireFormatLite::GetTagFieldNumber(field._4_4_);
      pFStack_a8 = Descriptor::FindFieldByNumber((Descriptor *)reflection,number);
      if ((pFStack_a8 == (FieldDescriptor *)0x0) &&
         (bVar1 = Descriptor::IsExtensionNumber((Descriptor *)reflection,number), bVar1)) {
        pDVar3 = ParseContext::data((ParseContext *)descriptor);
        if (pDVar3->pool == (DescriptorPool *)0x0) {
          pFStack_a8 = Reflection::FindKnownExtensionByNumber((Reflection *)local_38,number);
        }
        else {
          pDVar3 = ParseContext::data((ParseContext *)descriptor);
          pFStack_a8 = DescriptorPool::FindExtensionByNumber
                                 (pDVar3->pool,(Descriptor *)reflection,number);
        }
      }
      ctx_local = (ParseContext *)
                  _InternalParseAndMergeField
                            ((Message *)ptr_local,(char *)ctx_local,(ParseContext *)descriptor,
                             (ulong)field._4_4_,(Reflection *)local_38,pFStack_a8);
    } while (ctx_local != (ParseContext *)0x0);
    msg_local = (Message *)0x0;
  }
  return (char *)msg_local;
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  ABSL_DCHECK(descriptor);
  ABSL_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}